

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeDensityZ.cpp
# Opt level: O2

void __thiscall OpenMD::ChargeDensityZ::generateXYZForLastFrame(ChargeDensityZ *this)

{
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *this_00;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *this_01;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *this_02;
  char cVar1;
  __type_conflict _Var2;
  ostream *poVar3;
  mapped_type *pmVar4;
  mapped_type_conflict *pmVar5;
  _Base_ptr p_Var6;
  long lVar7;
  size_t index;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double local_360;
  int key1;
  int key;
  double local_348;
  undefined8 uStack_340;
  _Base_ptr local_330;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *local_328;
  double local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  double local_310;
  _Base_ptr local_308;
  double local_300;
  double local_2f8;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_2f0;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_2e8;
  _Base_ptr local_2e0;
  double local_2d8;
  mapped_type_conflict local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  string a_name;
  string XYZFile;
  string a_name1;
  ofstream rdfStream;
  
  getPrefix((string *)&rdfStream,&this->fileName_);
  std::operator+(&XYZFile,(string *)&rdfStream,".xyz");
  std::__cxx11::string::~string((string *)&rdfStream);
  std::ofstream::ofstream(&rdfStream,XYZFile._M_dataplus._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"XYZ file: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&rdfStream,
                        (int)(this->zPosUsingGlobalIndex_)._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count);
    std::operator<<(poVar3,"\n");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&rdfStream,1);
    std::operator<<(poVar3,";\t");
    poVar3 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)(this->hmat_).super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_ +
                         (ulong)(uint)this->x_ * 0x20));
    std::operator<<(poVar3,"\t");
    poVar3 = std::ostream::_M_insert<double>
                       ((this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                        .data_[(uint)this->x_][(uint)this->y_]);
    std::operator<<(poVar3,"\t");
    poVar3 = std::ostream::_M_insert<double>
                       ((this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                        .data_[(uint)this->x_][(uint)this->axis_]);
    std::operator<<(poVar3,"\t");
    poVar3 = std::ostream::_M_insert<double>
                       ((this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                        .data_[(uint)this->y_][(uint)this->x_]);
    std::operator<<(poVar3,"\t");
    poVar3 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)(this->hmat_).super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_ +
                         (ulong)(uint)this->y_ * 0x20));
    std::operator<<(poVar3,"\t");
    poVar3 = std::ostream::_M_insert<double>
                       ((this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                        .data_[(uint)this->y_][(uint)this->axis_]);
    std::operator<<(poVar3,"\t");
    poVar3 = std::ostream::_M_insert<double>
                       ((this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                        .data_[(uint)this->axis_][(uint)this->x_]);
    std::operator<<(poVar3,"\t");
    poVar3 = std::ostream::_M_insert<double>
                       ((this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                        .data_[(uint)this->axis_][(uint)this->y_]);
    std::operator<<(poVar3,"\t");
    poVar3 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)(this->hmat_).super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_ +
                         (ulong)(uint)this->axis_ * 0x20));
    std::operator<<(poVar3,"\n");
    this_00 = &this->zPosUsingGlobalIndex_;
    local_330 = &(this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_header;
    this_01 = &this->xPosUsingGlobalIndex_;
    this_02 = &this->yPosUsingGlobalIndex_;
    local_318 = &this->atomFlucCharge_;
    local_328 = &this->totalChargeUsingGlobalIndex_;
    local_2e8 = &this->vanderRUsingGlobalIndex_;
    local_2f0 = &this->averageChargeUsingGlobalIndex_;
    p_Var6 = (this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (p_Var6 != local_330) {
      key = p_Var6[1]._M_color;
      local_308 = p_Var6;
      std::__cxx11::string::string((string *)&a_name,(string *)&p_Var6[1]._M_parent);
      pmVar4 = std::
               map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
               ::operator[](this_00,&key);
      local_2f8 = (pmVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish[-1];
      pmVar4 = std::
               map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
               ::operator[](this_01,&key);
      local_300 = (pmVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish[-1];
      pmVar4 = std::
               map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
               ::operator[](this_02,&key);
      local_310 = (pmVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish[-1];
      _Var2 = std::operator==(&a_name,local_318);
      if (_Var2) {
        p_Var6 = (this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_360 = 0.0;
        while (p_Var6 != local_330) {
          key1 = p_Var6[1]._M_color;
          local_2e0 = p_Var6;
          std::__cxx11::string::string((string *)&a_name1,(string *)&p_Var6[1]._M_parent);
          pmVar5 = std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::operator[](local_2e8,&key1);
          local_348 = *pmVar5;
          pmVar5 = std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::operator[](local_2f0,&key1);
          local_2d0 = *pmVar5;
          local_2c8 = local_348 * local_348 + local_348 * local_348;
          local_320 = local_348 * 6.283185307179586 * local_348;
          local_2d8 = SQRT(local_320);
          uVar8 = 0;
          while( true ) {
            pmVar4 = std::
                     map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                     ::operator[](this_00,&key1);
            if ((ulong)((long)(pmVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(pmVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_start >> 3) <= uVar8) break;
            pmVar4 = std::
                     map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                     ::operator[](this_01,&key);
            local_348 = (pmVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar8];
            pmVar4 = std::
                     map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                     ::operator[](this_02,&key);
            dVar11 = (pmVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar8];
            pmVar4 = std::
                     map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                     ::operator[](this_00,&key);
            dVar9 = (pmVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar8];
            pmVar4 = std::
                     map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                     ::operator[](this_00,&key1);
            local_2b0 = (pmVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar8];
            pmVar4 = std::
                     map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                     ::operator[](this_01,&key1);
            local_2b8 = (pmVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar8];
            pmVar4 = std::
                     map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                     ::operator[](this_02,&key1);
            local_2c0 = (pmVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar8];
            pmVar4 = std::
                     map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                     ::operator[](local_328,&key1);
            dVar9 = dVar9 - local_2b0;
            dVar12 = local_348 - local_2b8;
            dVar11 = dVar11 - local_2c0;
            local_348 = (pmVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar8];
            uStack_340 = 0;
            dVar9 = exp(-(dVar9 * dVar9 + dVar12 * dVar12 + dVar11 * dVar11) / local_2c8);
            dVar11 = local_2d8;
            if (local_320 < 0.0) {
              dVar11 = sqrt(local_320);
            }
            local_360 = local_360 +
                        (dVar9 / dVar11) *
                        (double)(-(ulong)(1e-06 < ABS(local_348 - local_2d0)) &
                                (ulong)(local_348 - local_2d0));
            uVar8 = uVar8 + 1;
          }
          std::__cxx11::string::~string((string *)&a_name1);
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(local_2e0);
        }
        lVar7 = (long)this->nProcessed_ *
                (this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar10._0_8_ = lVar7;
        auVar10._12_4_ = 0x45300000;
        local_360 = local_360 /
                    ((auVar10._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
      }
      else {
        pmVar4 = std::
                 map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator[](local_328,&key);
        local_360 = (pmVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish[-1];
      }
      poVar3 = std::operator<<((ostream *)&rdfStream,(string *)&a_name);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>(local_2f8);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>(local_300);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>(local_310);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>(local_360);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&a_name);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(local_308);
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&rdfStream);
  std::__cxx11::string::~string((string *)&XYZFile);
  return;
}

Assistant:

void ChargeDensityZ::generateXYZForLastFrame() {
    std::string XYZFile(getPrefix(fileName_) + ".xyz");
    std::ofstream rdfStream(XYZFile.c_str());
    int nAtoms = zPosUsingGlobalIndex_.size();

    if (rdfStream.is_open()) {
      rdfStream << nAtoms << "\n";
      rdfStream << 1 << ";\t" << hmat_(x_, x_) << "\t" << hmat_(x_, y_) << "\t"
                << hmat_(x_, axis_) << "\t" << hmat_(y_, x_) << "\t"
                << hmat_(y_, y_) << "\t" << hmat_(y_, axis_) << "\t"
                << hmat_(axis_, x_) << "\t" << hmat_(axis_, y_) << "\t"
                << hmat_(axis_, axis_) << "\n";

      for (std::map<int, std::string>::iterator it =
               atomNameGlobalIndex_.begin();
           it != atomNameGlobalIndex_.end(); ++it) {
        int key            = it->first;
        std::string a_name = it->second;
        RealType x         = zPosUsingGlobalIndex_[key].back();
        RealType y         = xPosUsingGlobalIndex_[key].back();
        RealType z         = yPosUsingGlobalIndex_[key].back();
        RealType charge    = 0;

        if (a_name == atomFlucCharge_) {
          for (std::map<int, std::string>::iterator it1 =
                   atomNameGlobalIndex_.begin();
               it1 != atomNameGlobalIndex_.end(); ++it1) {
            int key1            = it1->first;
            std::string a_name1 = it1->second;

            RealType v_radius      = vanderRUsingGlobalIndex_[key1];
            RealType v_radius2     = v_radius * v_radius;
            RealType averageCharge = averageChargeUsingGlobalIndex_[key1];

            for (size_t index = 0; index < zPosUsingGlobalIndex_[key1].size();
                 ++index) {
              RealType xt = xPosUsingGlobalIndex_[key][index];
              RealType yt = yPosUsingGlobalIndex_[key][index];
              RealType zt = zPosUsingGlobalIndex_[key][index];

              RealType z_pos = zPosUsingGlobalIndex_[key1][index];
              RealType x_pos = xPosUsingGlobalIndex_[key1][index];
              RealType y_pos = yPosUsingGlobalIndex_[key1][index];
              RealType r2    = (xt - x_pos) * (xt - x_pos) +
                            (yt - y_pos) * (yt - y_pos) +
                            (zt - z_pos) * (zt - z_pos);

              RealType charge_for_atom =
                  totalChargeUsingGlobalIndex_[key1][index];
              RealType chargeDiff =
                  fabs(charge_for_atom - averageCharge) > epsilon ?
                      charge_for_atom - averageCharge :
                      0;
              RealType gaussian_scale =
                  exp(-r2 / (v_radius2 * 2.0)) /
                  (sqrt(2 * Constants::PI * v_radius * v_radius));
              //  RealType gaussian_scale = 2 * (r2 /( v_radius2 * v_radius)) *
              //  exp(-r2/(v_radius2*2.0)) / (sqrt(2*Constants::PI)* v_radius2 *
              //  v_radius);
              charge += chargeDiff * gaussian_scale;
            }
          }
          charge /= (nProcessed_ * atomNameGlobalIndex_.size());

        } else {
          charge = totalChargeUsingGlobalIndex_[key].back();
        }

        rdfStream << a_name << "\t" << x << "\t" << y << "\t" << z << "\t"
                  << charge << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "XYZ file: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }